

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O0

QList<QSslCertificateExtension> * __thiscall
QSslCertificatePrivate::extensions(QSslCertificatePrivate *this)

{
  int iVar1;
  int iVar2;
  pointer pXVar3;
  undefined4 extraout_var;
  QSslCertificateExtensionPrivate *pQVar4;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  qsizetype nExt;
  QList<QSslCertificateExtension> *result;
  QSslCertificateExtension ext;
  undefined6 in_stack_ffffffffffffff58;
  byte in_stack_ffffffffffffff5e;
  byte in_stack_ffffffffffffff5f;
  QVariant *this_00;
  long local_88;
  undefined1 local_60 [24];
  undefined1 local_48 [24];
  undefined8 local_30;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).data.shared = (PrivateShared *)0xaaaaaaaaaaaaaaaa;
  *(QSslCertificateExtension **)((long)&(in_RDI->d).data + 8) =
       (QSslCertificateExtension *)0xaaaaaaaaaaaaaaaa;
  *(qsizetype *)((long)&(in_RDI->d).data + 0x10) = -0x5555555555555556;
  this_00 = in_RDI;
  QList<QSslCertificateExtension>::QList((QList<QSslCertificateExtension> *)0x26da07);
  pXVar3 = std::
           unique_ptr<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
           ::get((unique_ptr<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
                  *)0x26da15);
  if (pXVar3 != (pointer)0x0) {
    pXVar3 = std::
             unique_ptr<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
             ::operator->((unique_ptr<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
                           *)0x26da2d);
    iVar1 = (*pXVar3->_vptr_X509Certificate[0x11])();
    for (local_88 = 0; local_88 < CONCAT44(extraout_var,iVar1); local_88 = local_88 + 1) {
      local_30 = 0xaaaaaaaaaaaaaaaa;
      QSslCertificateExtension::QSslCertificateExtension((QSslCertificateExtension *)in_RDI);
      pXVar3 = std::
               unique_ptr<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
               ::operator->((unique_ptr<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
                             *)0x26da7b);
      (*pXVar3->_vptr_X509Certificate[0x12])(local_48,pXVar3,local_88);
      QSharedDataPointer<QSslCertificateExtensionPrivate>::operator->
                ((QSharedDataPointer<QSslCertificateExtensionPrivate> *)in_RDI);
      QString::operator=((QString *)in_RDI,
                         (QString *)
                         CONCAT17(in_stack_ffffffffffffff5f,
                                  CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
      QString::~QString((QString *)0x26dab6);
      pXVar3 = std::
               unique_ptr<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
               ::operator->((unique_ptr<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
                             *)0x26dac4);
      (*pXVar3->_vptr_X509Certificate[0x13])(local_60,pXVar3,local_88);
      QSharedDataPointer<QSslCertificateExtensionPrivate>::operator->
                ((QSharedDataPointer<QSslCertificateExtensionPrivate> *)in_RDI);
      QString::operator=((QString *)in_RDI,
                         (QString *)
                         CONCAT17(in_stack_ffffffffffffff5f,
                                  CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
      QString::~QString((QString *)0x26daff);
      pXVar3 = std::
               unique_ptr<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
               ::operator->((unique_ptr<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
                             *)0x26db0d);
      (*pXVar3->_vptr_X509Certificate[0x14])(&local_28,pXVar3,local_88);
      QSharedDataPointer<QSslCertificateExtensionPrivate>::operator->
                ((QSharedDataPointer<QSslCertificateExtensionPrivate> *)in_RDI);
      QVariant::operator=(this_00,in_RDI);
      QVariant::~QVariant(&local_28);
      pXVar3 = std::
               unique_ptr<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
               ::operator->((unique_ptr<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
                             *)0x26db5f);
      iVar2 = (*pXVar3->_vptr_X509Certificate[0x15])(pXVar3,local_88);
      in_stack_ffffffffffffff5e = (byte)iVar2;
      pQVar4 = QSharedDataPointer<QSslCertificateExtensionPrivate>::operator->
                         ((QSharedDataPointer<QSslCertificateExtensionPrivate> *)in_RDI);
      pQVar4->critical = (bool)(in_stack_ffffffffffffff5e & 1);
      pXVar3 = std::
               unique_ptr<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
               ::operator->((unique_ptr<QTlsPrivate::X509Certificate,_std::default_delete<QTlsPrivate::X509Certificate>_>
                             *)0x26db96);
      iVar2 = (*pXVar3->_vptr_X509Certificate[0x16])(pXVar3,local_88);
      in_stack_ffffffffffffff5f = (byte)iVar2;
      pQVar4 = QSharedDataPointer<QSslCertificateExtensionPrivate>::operator->
                         ((QSharedDataPointer<QSslCertificateExtensionPrivate> *)in_RDI);
      pQVar4->supported = (bool)(in_stack_ffffffffffffff5f & 1);
      QList<QSslCertificateExtension>::operator<<
                ((QList<QSslCertificateExtension> *)in_RDI,
                 (parameter_type)
                 CONCAT17(in_stack_ffffffffffffff5f,
                          CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
      QSslCertificateExtension::~QSslCertificateExtension((QSslCertificateExtension *)0x26dbd8);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QList<QSslCertificateExtension> *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QList<QSslCertificateExtension> QSslCertificatePrivate::extensions() const
{
    QList<QSslCertificateExtension> result;

    if (backend.get()) {
        auto nExt = backend->numberOfExtensions();
        for (decltype (nExt) i = 0; i < nExt; ++i) {
            QSslCertificateExtension ext;
            ext.d->oid = backend->oidForExtension(i);
            ext.d->name = backend->nameForExtension(i);
            ext.d->value = backend->valueForExtension(i);
            ext.d->critical = backend->isExtensionCritical(i);
            ext.d->supported = backend->isExtensionSupported(i);
            result << ext;
        }
    }

    return result;
}